

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O0

void HBLAS2::hblas2_gemv_square_LDSame<HAXX::quaternion<double>,std::complex<double>,(char)84>(void)

{
  complex<double> BETA_00;
  quaternion<double> ALPHA_00;
  bool bVar1;
  ostream *poVar2;
  quaternion<double> *Y_00;
  quaternion<double> *__y;
  quaternion<double> *__y_00;
  ostream *this;
  reference pvVar3;
  reference X_00;
  result_type_conflict1 in_XMM0_Qa;
  quaternion<double> tmp;
  int32_t AStride;
  int32_t ACOL;
  int32_t AROW;
  int i;
  stringstream ss;
  complex<double> BETA;
  quaternion<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  quaternion<double> *x_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_fffffffffffff958;
  undefined1 pv_;
  quaternion<double> *__y_01;
  uniform_real_distribution<double> *in_stack_fffffffffffff960;
  quaternion<double> *__x;
  lazy_ostream *prev;
  allocator_type *in_stack_fffffffffffff970;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *this_00;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff980;
  int32_t in_stack_fffffffffffff98c;
  quaternion<double> *in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  int32_t iVar4;
  undefined8 in_stack_fffffffffffff9a0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9a8;
  undefined8 uVar5;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9b0;
  int32_t INCY;
  basic_cstring<const_char> local_568;
  basic_cstring<const_char> local_558;
  undefined1 local_548 [32];
  undefined8 local_528;
  quaternion<double> *in_stack_fffffffffffffb88;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb90;
  undefined1 local_460 [24];
  undefined1 local_448 [16];
  basic_cstring<const_char> local_438;
  double local_428;
  double local_420;
  double local_418;
  quaternion<double> *local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double in_stack_fffffffffffffc28;
  quaternion<double> *in_stack_fffffffffffffc30;
  int iVar6;
  int INCX;
  int iVar7;
  result_type_conflict1 rVar8;
  string local_380 [32];
  stringstream local_360 [16];
  ostream local_350 [376];
  result_type_conflict1 local_1d8 [2];
  quaternion<double> *local_1c8;
  quaternion<double> *pqStack_1c0;
  lazy_ostream *plStack_1b8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *pvStack_1b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_1a8;
  result_type_conflict1 local_190;
  result_type_conflict1 local_188;
  result_type_conflict1 local_180;
  result_type_conflict1 local_178;
  quaternion<double> local_170;
  reference local_150;
  quaternion<double> *local_148;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_140;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_138;
  result_type_conflict1 local_130;
  result_type_conflict1 local_128;
  result_type_conflict1 local_120;
  result_type_conflict1 local_118;
  quaternion<double> local_110;
  reference local_f0;
  quaternion<double> *local_e8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_e0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_d8;
  result_type_conflict1 local_d0;
  result_type_conflict1 local_c8;
  result_type_conflict1 local_c0;
  result_type_conflict1 local_b8;
  quaternion<double> local_b0;
  reference local_90;
  quaternion<double> *local_88;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_80;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_78;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_68;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_18;
  
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1ed9ac);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff980,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
             ,in_stack_fffffffffffff970);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1ed9d5);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1ed9ea);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff980,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
             ,in_stack_fffffffffffff970);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1eda13);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1eda28);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff980,CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
             ,in_stack_fffffffffffff970);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1eda51);
  local_78 = local_48;
  local_80._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff958);
  local_88 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff958);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff960,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff958);
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_80);
    local_b8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_c0 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_c8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()
                           (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_d0 = in_XMM0_Qa;
    HAXX::quaternion<double>::quaternion(&local_b0,&local_b8,&local_c0,&local_c8,&local_d0);
    local_90->_M_real = local_b0._M_real;
    local_90->_M_imag_i = local_b0._M_imag_i;
    local_90->_M_imag_j = local_b0._M_imag_j;
    local_90->_M_imag_k = local_b0._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_80);
  }
  local_d8 = &local_68;
  local_e0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff958);
  local_e8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff958);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff960,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff958);
    if (!bVar1) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_e0);
    local_118 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_120 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_128 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()
                           (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_130 = in_XMM0_Qa;
    HAXX::quaternion<double>::quaternion(&local_110,&local_118,&local_120,&local_128,&local_130);
    local_f0->_M_real = local_110._M_real;
    local_f0->_M_imag_i = local_110._M_imag_i;
    local_f0->_M_imag_j = local_110._M_imag_j;
    local_f0->_M_imag_k = local_110._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_e0);
  }
  local_138 = &local_18;
  local_140._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff958);
  local_148 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          *)in_stack_fffffffffffff958);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff960,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff958);
    iVar4 = (int32_t)((ulong)in_stack_fffffffffffff998 >> 0x20);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_140);
    local_178 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_180 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_188 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    in_XMM0_Qa = std::uniform_real_distribution<double>::operator()
                           (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    local_190 = in_XMM0_Qa;
    HAXX::quaternion<double>::quaternion(&local_170,&local_178,&local_180,&local_188,&local_190);
    local_150->_M_real = local_170._M_real;
    local_150->_M_imag_i = local_170._M_imag_i;
    local_150->_M_imag_j = local_170._M_imag_j;
    local_150->_M_imag_k = local_170._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_140);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  genRandom<HAXX::quaternion<double>>();
  genRandom<std::complex<double>>();
  local_1d8[0] = in_XMM0_Qa;
  std::__cxx11::stringstream::stringstream(local_360);
  poVar2 = std::operator<<(local_350,"hblas2_gemv_square_");
  std::operator<<(poVar2,'T');
  std::operator<<(local_350,"Q");
  std::operator<<(local_350,"C");
  std::operator<<(local_350,"_LDSame");
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)&std::cout,local_380);
  Y_00 = (quaternion<double> *)std::operator<<(poVar2," will use");
  INCY = (int32_t)poVar2;
  std::ostream::operator<<(Y_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_380);
  __y = (quaternion<double> *)std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  __y_00 = (quaternion<double> *)
           HAXX::operator<<(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::ostream::operator<<(__y_00,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"  BETA = ");
  this = std::operator<<(poVar2,(complex *)local_1d8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
            (&local_18,0);
  pvVar3 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](local_48,0);
  rVar8 = local_1d8[0];
  X_00 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
         operator[](&local_68,0);
  ALPHA_00._M_imag_i = (double)this;
  ALPHA_00._M_real = (double)pvVar3;
  ALPHA_00._M_imag_j = (double)poVar2;
  ALPHA_00._M_imag_k = (double)__y_00;
  BETA_00._M_value._8_8_ = in_stack_fffffffffffff9b0;
  BETA_00._M_value._0_8_ = in_stack_fffffffffffff9a8;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>>
            ((char)((ulong)in_stack_fffffffffffff9a0 >> 0x38),(int32_t)in_stack_fffffffffffff9a0,
             iVar4,ALPHA_00,in_stack_fffffffffffff990,in_stack_fffffffffffff98c,X_00,(int32_t)__y,
             BETA_00,Y_00,INCY);
  INCX = 0;
  __y_01 = local_1c8;
  __x = pqStack_1c0;
  prev = plStack_1b8;
  this_00 = pvStack_1b0;
  while (iVar4 = (int32_t)((ulong)in_stack_fffffffffffffc28 >> 0x20), INCX < 100) {
    iVar6 = 0;
    local_3f0 = 0.0;
    local_3f8 = 0.0;
    local_400 = 0.0;
    local_408 = 0.0;
    iVar7 = INCX;
    HAXX::quaternion<double>::quaternion
              ((quaternion<double> *)&local_3e8,&local_3f0,&local_3f8,&local_400,&local_408);
    pvVar3 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](&local_18,(long)(iVar6 + INCX * 100));
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (local_48,0);
    HAXX::HBLAS_DOTUV<double>
              ((int32_t)((ulong)rVar8 >> 0x20),(quaternion<double> *)CONCAT44(iVar7,iVar6),INCX,
               in_stack_fffffffffffffc30,iVar4);
    local_3e8 = local_428;
    local_3e0 = local_420;
    in_stack_fffffffffffffc28 = local_418;
    in_stack_fffffffffffffc30 = local_410;
    do {
      uVar5 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_438,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)__x);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar5,&local_438,0x47,local_448);
      HAXX::operator*(Y_00,__y);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_1a8,(long)iVar7);
      HAXX::operator*((complex<double> *)__y,__y_00);
      HAXX::operator+(__x,__y_01);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_68,(long)iVar7);
      HAXX::inv<double>(pvVar3);
      HAXX::operator*(Y_00,__y);
      local_528 = 0x3ff0000000000000;
      HAXX::operator-(__x,&__y_01->_M_real);
      pv_ = (undefined1)((ulong)__y_01 >> 0x38);
      HAXX::norm<double>(X_00);
      boost::test_tools::assertion_result::assertion_result((assertion_result *)__x,(bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_558,
                 "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )",0x48);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)__x);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_568,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      __y_01 = (quaternion<double> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_460,local_548,&local_568,0x47,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1ee5f2);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1ee5ff);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    INCX = iVar7 + 1;
  }
  std::__cxx11::stringstream::~stringstream(local_360);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            (this_00);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            (this_00);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            (this_00);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            (this_00);
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}